

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UShrtField.cpp
# Opt level: O2

void __thiscall
ki::dml::Field<unsigned_short>::read_from(Field<unsigned_short> *this,istream *istream)

{
  ostream *poVar1;
  parse_error *this_00;
  ValueBytes<unsigned_short> data;
  string local_1b0;
  ostringstream oss;
  
  data.value = 0;
  std::istream::read((char *)istream,(long)&data);
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
    this->m_value = (unsigned_short)data;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Not enough data was available to read USHRT value (");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_FieldBase).m_name);
  std::operator<<(poVar1,").");
  this_00 = (parse_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  parse_error::parse_error(this_00,&local_1b0);
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UShrtField::read_from(std::istream &istream)
	{
		ValueBytes<USHRT> endianness_check;
		endianness_check.value = 0x0102;
		ValueBytes<USHRT> data;
		istream.read(data.buff, sizeof(USHRT));
		if (istream.fail())
		{
			std::ostringstream oss;
			oss << "Not enough data was available to read USHRT value (" << m_name << ").";
			throw parse_error(oss.str());
		}

		if (endianness_check.buff[0] == 0x01)
			std::reverse(&data.buff[0], &data.buff[2]);
		m_value = data.value;
	}